

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall
QPlainTextEditPrivate::append(QPlainTextEditPrivate *this,QString *text,TextFormat format)

{
  undefined1 uVar1;
  undefined1 uVar2;
  QObject *pQVar3;
  QPlainTextEditControl *pQVar4;
  QWidgetData *pQVar5;
  QScrollBar *this_00;
  bool bVar6;
  int iVar7;
  int iVar8;
  QTextDocument *pQVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  double dVar12;
  qreal qVar13;
  QTextCursor cursor;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 *local_50;
  undefined4 *local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QObject **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  pQVar9 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
  QTextDocument::documentLayout();
  lVar10 = QMetaObject::cast((QObject *)&QPlainTextDocumentLayout::staticMetaObject);
  iVar7 = QTextDocument::maximumBlockCount();
  if (iVar7 != 0) {
    QTextDocument::setMaximumBlockCount((int)pQVar9);
  }
  lVar11 = *(long *)(pQVar3 + 0x20);
  if (*(short *)(lVar11 + 8) < 0) {
    pQVar4 = this->control;
    QTextDocument::lastBlock();
    (**(code **)(*(long *)&pQVar4->super_QWidgetTextControl + 0x80))(&local_58,pQVar4,&local_68);
    dVar12 = (double)local_50 + local_40;
    qVar13 = verticalOffset(this,this->control->topBlock,this->topLine);
    pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    bVar6 = dVar12 - (qVar13 + this->topLineFracture) <=
            (double)((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i);
    lVar11 = *(long *)(pQVar3 + 0x20);
  }
  else {
    bVar6 = false;
  }
  if ((*(byte *)(lVar11 + 9) & 0x80) == 0) {
    this->field_0x348 = this->field_0x348 | 2;
  }
  uVar1 = *(undefined1 *)(*(long *)(lVar10 + 8) + 0xb9);
  *(undefined1 *)(*(long *)(lVar10 + 8) + 0xb9) = 1;
  pQVar4 = this->control;
  if (format == PlainText) {
    QWidgetTextControl::appendPlainText((QWidgetTextControl *)pQVar4,text);
  }
  else if (format == RichText) {
    QWidgetTextControl::appendHtml((QWidgetTextControl *)pQVar4,text);
  }
  else {
    QWidgetTextControl::append((QWidgetTextControl *)pQVar4,text);
  }
  if (0 < iVar7) {
    iVar8 = QTextDocument::blockCount();
    if (iVar7 < iVar8) {
      iVar7 = this->control->topBlock;
      if (iVar7 != 0) {
        this->control->topBlock = iVar7 + -1;
        pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
        local_60 = CONCAT44((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i,
                            (pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i);
        local_50 = &local_68;
        local_68 = 0;
        local_48 = &local_6c;
        local_6c = 0;
        local_58 = (undefined1 *)0x0;
        QMetaObject::activate(pQVar3,&QPlainTextEdit::staticMetaObject,6,&local_58);
      }
      uVar2 = *(undefined1 *)(*(long *)(lVar10 + 8) + 0xb8);
      *(bool *)(*(long *)(lVar10 + 8) + 0xb8) = iVar7 != 0;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_58,pQVar9);
      QTextCursor::movePosition((MoveOperation)(QTextCursor *)&local_58,0x10,1);
      QTextCursor::removeSelectedText();
      *(undefined1 *)(*(long *)(lVar10 + 8) + 0xb8) = uVar2;
      QTextCursor::~QTextCursor((QTextCursor *)&local_58);
    }
    QTextDocument::setMaximumBlockCount((int)pQVar9);
  }
  *(undefined1 *)(*(long *)(lVar10 + 8) + 0xb9) = uVar1;
  adjustScrollbars(this);
  if (bVar6) {
    if ((this->field_0x348 & 8) != 0) {
      pQVar4 = this->control;
      QTextDocument::lastBlock();
      (**(code **)(*(long *)&pQVar4->super_QWidgetTextControl + 0x80))(&local_58,pQVar4,&local_68);
      dVar12 = (double)local_50 + local_40;
      qVar13 = verticalOffset(this,this->control->topBlock,this->topLine);
      pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      if (dVar12 - (qVar13 + this->topLineFracture) <=
          (double)((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i)) goto LAB_0049bef7;
    }
    this_00 = (this->super_QAbstractScrollAreaPrivate).vbar;
    iVar7 = QAbstractSlider::maximum(&this_00->super_QAbstractSlider);
    QAbstractSlider::setValue(&this_00->super_QAbstractSlider,iVar7);
  }
LAB_0049bef7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::append(const QString &text, Qt::TextFormat format)
{
    Q_Q(QPlainTextEdit);

    QTextDocument *document = control->document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(document->documentLayout());
    Q_ASSERT(documentLayout);

    int maximumBlockCount = document->maximumBlockCount();
    if (maximumBlockCount)
        document->setMaximumBlockCount(0);

    const bool atBottom =  q->isVisible()
                           && (control->blockBoundingRect(document->lastBlock()).bottom() - verticalOffset()
                               <= viewport->rect().bottom());

    if (!q->isVisible())
        showCursorOnInitialShow = true;

    bool documentSizeChangedBlocked = documentLayout->priv()->blockDocumentSizeChanged;
    documentLayout->priv()->blockDocumentSizeChanged = true;

    switch (format) {
    case Qt::RichText:
        control->appendHtml(text);
        break;
    case Qt::PlainText:
        control->appendPlainText(text);
        break;
    default:
        control->append(text);
        break;
    }

    if (maximumBlockCount > 0) {
        if (document->blockCount() > maximumBlockCount) {
            bool blockUpdate = false;
            if (control->topBlock) {
                control->topBlock--;
                blockUpdate = true;
                emit q->updateRequest(viewport->rect(), 0);
            }

            bool updatesBlocked = documentLayout->priv()->blockUpdate;
            documentLayout->priv()->blockUpdate = blockUpdate;
            QTextCursor cursor(document);
            cursor.movePosition(QTextCursor::NextBlock, QTextCursor::KeepAnchor);
            cursor.removeSelectedText();
            documentLayout->priv()->blockUpdate = updatesBlocked;
        }
        document->setMaximumBlockCount(maximumBlockCount);
    }

    documentLayout->priv()->blockDocumentSizeChanged = documentSizeChangedBlocked;
    adjustScrollbars();


    if (atBottom) {
        const bool needScroll =  !centerOnScroll
                                 || control->blockBoundingRect(document->lastBlock()).bottom() - verticalOffset()
                                 > viewport->rect().bottom();
        if (needScroll)
            vbar->setValue(vbar->maximum());
    }
}